

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O2

int NeedCompressedAlpha(WebPIDecoder *idec)

{
  if (((idec->state != STATE_WEBP_HEADER) && (idec->is_lossless == 0)) &&
     (*(long *)((long)idec->dec + 0xb98) != 0)) {
    return (int)(*(int *)((long)idec->dec + 0xba8) == 0);
  }
  return 0;
}

Assistant:

static int NeedCompressedAlpha(const WebPIDecoder* const idec) {
  if (idec->state == STATE_WEBP_HEADER) {
    // We haven't parsed the headers yet, so we don't know whether the image is
    // lossy or lossless. This also means that we haven't parsed the ALPH chunk.
    return 0;
  }
  if (idec->is_lossless) {
    return 0;  // ALPH chunk is not present for lossless images.
  } else {
    const VP8Decoder* const dec = (VP8Decoder*)idec->dec;
    assert(dec != NULL);  // Must be true as idec->state != STATE_WEBP_HEADER.
    return (dec->alpha_data != NULL) && !dec->is_alpha_decoded;
  }
}